

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O0

int ecx_readPDOmapCA(ecx_contextt *context,uint16 Slave,int *Osize,int *Isize)

{
  int iVar1;
  char local_3d;
  uint8 local_37;
  byte local_36;
  uint8 SMt_bug_add;
  int Tsize;
  uint8 tSM;
  uint8 iSM;
  int iStack_30;
  uint8 nSM;
  int retVal;
  int rdl;
  int wkc;
  int *Isize_local;
  int *Osize_local;
  ecx_contextt *peStack_10;
  uint16 Slave_local;
  ecx_contextt *context_local;
  
  Tsize = 0;
  *Isize = 0;
  *Osize = 0;
  local_3d = '\0';
  iStack_30 = 10;
  context->SMcommtype->n = '\0';
  _rdl = Isize;
  Isize_local = Osize;
  Osize_local._6_2_ = Slave;
  peStack_10 = context;
  retVal = ecx_SDOread(context,Slave,0x1c00,'\0','\x01',&stack0xffffffffffffffd0,context->SMcommtype
                       ,700000);
  if ((0 < retVal) && (2 < peStack_10->SMcommtype->n)) {
    SMt_bug_add = peStack_10->SMcommtype->n - 1;
    if (8 < SMt_bug_add) {
      SMt_bug_add = '\b';
      ecx_packeterror(peStack_10,Osize_local._6_2_,0,'\0',10);
    }
    for (local_36 = 2; local_36 <= SMt_bug_add; local_36 = local_36 + 1) {
      local_37 = peStack_10->SMcommtype->SMtype[local_36];
      if ((local_36 == 2) && (local_37 == '\x02')) {
        local_3d = '\x01';
      }
      if (local_37 != '\0') {
        local_37 = local_37 + local_3d;
      }
      peStack_10->slavelist[Osize_local._6_2_].SMtype[local_36] = local_37;
      if (local_37 == '\0') {
        peStack_10->slavelist[Osize_local._6_2_].SM[local_36].SMflags =
             peStack_10->slavelist[Osize_local._6_2_].SM[local_36].SMflags & 0xfffeffff;
      }
      if (((local_37 == '\x03') || (local_37 == '\x04')) &&
         (iVar1 = ecx_readPDOassignCA(peStack_10,Osize_local._6_2_,local_36 + 0x1c10), iVar1 != 0))
      {
        peStack_10->slavelist[Osize_local._6_2_].SM[local_36].SMlength =
             (uint16)((long)(iVar1 + 7) / 8);
        if (local_37 == '\x03') {
          *Isize_local = iVar1 + *Isize_local;
        }
        else {
          *_rdl = iVar1 + *_rdl;
        }
      }
    }
  }
  if ((0 < *_rdl) || (0 < *Isize_local)) {
    Tsize = 1;
  }
  return Tsize;
}

Assistant:

int ecx_readPDOmapCA(ecx_contextt *context, uint16 Slave, int *Osize, int *Isize)
{
   int wkc, rdl;
   int retVal = 0;
   uint8 nSM, iSM, tSM;
   int Tsize;
   uint8 SMt_bug_add;
   
   *Isize = 0;
   *Osize = 0;
   SMt_bug_add = 0;
   rdl = sizeof(ec_SMcommtypet); 
   context->SMcommtype->n = 0;
   /* read SyncManager Communication Type object count Complete Access*/
   wkc = ecx_SDOread(context, Slave, ECT_SDO_SMCOMMTYPE, 0x00, TRUE, &rdl, context->SMcommtype, EC_TIMEOUTRXM);
   /* positive result from slave ? */
   if ((wkc > 0) && (context->SMcommtype->n > 2))
   {
      /* make nSM equal to number of defined SM */
      nSM = context->SMcommtype->n - 1;
      /* limit to maximum number of SM defined, if true the slave can't be configured */
      if (nSM > EC_MAXSM)
      {
         nSM = EC_MAXSM;
         ecx_packeterror(context, Slave, 0, 0, 10); /* #SM larger than EC_MAXSM */         
      }
      /* iterate for every SM type defined */
      for (iSM = 2 ; iSM <= nSM ; iSM++)
      {
          tSM = context->SMcommtype->SMtype[iSM];

// start slave bug prevention code, remove if possible            
         if((iSM == 2) && (tSM == 2)) // SM2 has type 2 == mailbox out, this is a bug in the slave!
         {
            SMt_bug_add = 1; // try to correct, this works if the types are 0 1 2 3 and should be 1 2 3 4
         }
         if(tSM)
         {
            tSM += SMt_bug_add; // only add if SMt > 0
         }
// end slave bug prevention code
         
         context->slavelist[Slave].SMtype[iSM] = tSM;
         /* check if SM is unused -> clear enable flag */
         if (tSM == 0)
         {
            context->slavelist[Slave].SM[iSM].SMflags =
               htoel( etohl(context->slavelist[Slave].SM[iSM].SMflags) & EC_SMENABLEMASK);
         }
         if ((tSM == 3) || (tSM == 4))
         {
            /* read the assign PDO */
            Tsize = ecx_readPDOassignCA(context, Slave, ECT_SDO_PDOASSIGN + iSM );
            /* if a mapping is found */
            if (Tsize)
            {
               context->slavelist[Slave].SM[iSM].SMlength = htoes((Tsize + 7) / 8);
               if (tSM == 3)
               {
                  /* we are doing outputs */
                  *Osize += Tsize;
               }
               else
               {
                  /* we are doing inputs */
                  *Isize += Tsize;
               }
            }   
         }   
      }
   }

   /* found some I/O bits ? */
   if ((*Isize > 0) || (*Osize > 0))
   {
      retVal = 1;
   }
   return retVal;
}